

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void flatview_add_to_dispatch_sparc
               (uc_struct_conflict8 *uc,FlatView *fv,MemoryRegionSection *section)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined1 a_02 [16];
  undefined1 a_03 [16];
  undefined1 a_04 [16];
  undefined1 a_05 [16];
  undefined1 a_06 [16];
  undefined1 a_07 [16];
  undefined1 a_08 [16];
  undefined1 a_09 [16];
  undefined1 a_10 [16];
  undefined1 b [16];
  undefined1 b_00 [16];
  undefined1 b_01 [16];
  undefined1 b_02 [16];
  undefined1 b_03 [16];
  undefined1 b_04 [16];
  undefined1 b_05 [16];
  _Bool _Var1;
  Int128 *__return_storage_ptr__;
  Int128 *pIVar2;
  uint64_t uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  FlatView *a_11;
  undefined8 in_stack_fffffffffffffd48;
  undefined8 uVar4;
  undefined8 in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  Int128 *pIStack_1e8;
  MemoryRegionSection now_1;
  Int128 *pIStack_d8;
  MemoryRegionSection now;
  uint64_t left;
  Int128 page_size;
  MemoryRegionSection remain;
  MemoryRegionSection *section_local;
  FlatView *fv_local;
  uc_struct_conflict8 *uc_local;
  
  page_size._8_8_ = *(Int128 **)&section->size;
  remain.size._0_8_ = *(undefined8 *)((long)&section->size + 8);
  remain.size._8_8_ = section->mr;
  remain.mr = (MemoryRegion *)section->fv;
  remain.fv = (FlatView *)section->offset_within_region;
  remain.offset_within_region = section->offset_within_address_space;
  remain.offset_within_address_space = *(hwaddr *)&section->readonly;
  remain.readonly = (_Bool)section->field_0x38;
  remain._49_7_ = *(undefined7 *)&section->field_0x39;
  a_11 = fv;
  __return_storage_ptr__ = int128_make64((Int128 *)0x1000,(uint64_t)fv);
  if ((remain.offset_within_region & 0xfff) != 0) {
    now.offset_within_address_space = remain.offset_within_address_space;
    now.readonly = remain.readonly;
    now._49_7_ = remain._49_7_;
    now.fv = remain.fv;
    now.offset_within_region = remain.offset_within_region;
    now.size._8_8_ = remain.size._8_8_;
    now.mr = remain.mr;
    pIStack_d8 = page_size._8_8_;
    now.size._0_8_ = (undefined8)remain.size;
    pIVar2 = int128_make64((Int128 *)
                           ((remain.offset_within_region + 0xfff & 0xfffffffffffff000) -
                           remain.offset_within_region),(uint64_t)a_11);
    a._8_8_ = in_stack_fffffffffffffd50;
    a._0_8_ = in_stack_fffffffffffffd48;
    b._8_8_ = in_stack_fffffffffffffd60;
    b._0_8_ = in_stack_fffffffffffffd58;
    pIStack_d8 = int128_min(pIVar2,(Int128)a,(Int128)b);
    register_subpage(uc,fv,(MemoryRegionSection *)&pIStack_d8);
    a_00._8_8_ = in_stack_fffffffffffffd50;
    a_00._0_8_ = in_stack_fffffffffffffd48;
    b_00._8_8_ = in_stack_fffffffffffffd60;
    b_00._0_8_ = in_stack_fffffffffffffd58;
    _Var1 = int128_eq((Int128)a_00,(Int128)b_00);
    if (_Var1) {
      return;
    }
    a_01._8_8_ = in_stack_fffffffffffffd50;
    a_01._0_8_ = in_stack_fffffffffffffd48;
    b_01._8_8_ = in_stack_fffffffffffffd60;
    b_01._0_8_ = in_stack_fffffffffffffd58;
    page_size._8_8_ = int128_sub(page_size._8_8_,(Int128)a_01,(Int128)b_01);
    a_02._8_8_ = in_stack_fffffffffffffd50;
    a_02._0_8_ = in_stack_fffffffffffffd48;
    remain.size._0_8_ = extraout_RDX;
    uVar3 = int128_get64((Int128)a_02);
    remain.offset_within_region = remain.offset_within_region + uVar3;
    a_03._8_8_ = in_stack_fffffffffffffd50;
    a_03._0_8_ = in_stack_fffffffffffffd48;
    uVar3 = int128_get64((Int128)a_03);
    remain.fv = (FlatView *)((long)&(remain.fv)->ref + uVar3);
  }
  a_04._8_8_ = in_stack_fffffffffffffd50;
  a_04._0_8_ = in_stack_fffffffffffffd48;
  b_02._8_8_ = in_stack_fffffffffffffd60;
  b_02._0_8_ = in_stack_fffffffffffffd58;
  now_1._56_8_ = __return_storage_ptr__;
  _Var1 = int128_ge((Int128)a_04,(Int128)b_02);
  if (_Var1) {
    now_1.offset_within_address_space = remain.offset_within_address_space;
    now_1.readonly = remain.readonly;
    now_1._49_7_ = remain._49_7_;
    now_1.fv = remain.fv;
    now_1.offset_within_region = remain.offset_within_region;
    now_1.size._8_8_ = remain.size._8_8_;
    now_1.mr = remain.mr;
    pIStack_1e8 = page_size._8_8_;
    now_1.size._0_8_ = (undefined8)remain.size;
    a_05._8_8_ = page_size._8_8_;
    a_05._0_8_ = (undefined8)remain.size;
    uVar4 = (undefined8)remain.size;
    pIVar2 = page_size._8_8_;
    int128_neg(__return_storage_ptr__,(Int128)a_05);
    a_06._8_8_ = pIVar2;
    a_06._0_8_ = uVar4;
    b_03._8_8_ = in_stack_fffffffffffffd60;
    b_03._0_8_ = in_stack_fffffffffffffd58;
    pIStack_1e8 = int128_and(pIVar2,(Int128)a_06,(Int128)b_03);
    register_multipage(uc,fv,(MemoryRegionSection *)&pIStack_1e8);
    a_07._8_8_ = pIVar2;
    a_07._0_8_ = uVar4;
    b_04._8_8_ = in_stack_fffffffffffffd60;
    b_04._0_8_ = in_stack_fffffffffffffd58;
    _Var1 = int128_eq((Int128)a_07,(Int128)b_04);
    if (_Var1) {
      return;
    }
    a_08._8_8_ = pIVar2;
    a_08._0_8_ = uVar4;
    b_05._8_8_ = in_stack_fffffffffffffd60;
    b_05._0_8_ = in_stack_fffffffffffffd58;
    page_size._8_8_ = int128_sub(page_size._8_8_,(Int128)a_08,(Int128)b_05);
    a_09._8_8_ = pIVar2;
    a_09._0_8_ = uVar4;
    remain.size._0_8_ = extraout_RDX_00;
    uVar3 = int128_get64((Int128)a_09);
    remain.offset_within_region = remain.offset_within_region + uVar3;
    a_10._8_8_ = pIVar2;
    a_10._0_8_ = uVar4;
    uVar3 = int128_get64((Int128)a_10);
    remain.fv = (FlatView *)((long)&(remain.fv)->ref + uVar3);
  }
  register_subpage(uc,fv,(MemoryRegionSection *)((long)&page_size + 8));
  return;
}

Assistant:

void flatview_add_to_dispatch(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    MemoryRegionSection remain = *section;
    Int128 page_size = int128_make64(TARGET_PAGE_SIZE);

    /* register first subpage */
    if (remain.offset_within_address_space & ~TARGET_PAGE_MASK) {
        uint64_t left = TARGET_PAGE_ALIGN(remain.offset_within_address_space)
                        - remain.offset_within_address_space;

        MemoryRegionSection now = remain;
        now.size = int128_min(int128_make64(left), now.size);
        register_subpage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register whole pages */
    if (int128_ge(remain.size, page_size)) {
        MemoryRegionSection now = remain;
        now.size = int128_and(now.size, int128_neg(page_size));
        register_multipage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register last subpage */
    register_subpage(uc, fv, &remain);
}